

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

bool __thiscall sf::Texture::generateMipmap(Texture *this)

{
  long in_RDI;
  TextureSaver save;
  TransientContextLock lock;
  TransientContextLock *in_stack_ffffffffffffffd0;
  TransientContextLock *in_stack_ffffffffffffffe0;
  bool local_1;
  
  if (*(int *)(in_RDI + 0x10) == 0) {
    local_1 = false;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(in_stack_ffffffffffffffe0);
    priv::ensureExtensionsInit();
    local_1 = SF_GLAD_GL_EXT_framebuffer_object != 0;
    if (local_1) {
      priv::TextureSaver::TextureSaver((TextureSaver *)0x2ac13e);
      (*sf_glad_glBindTexture)(0xde1,*(GLuint *)(in_RDI + 0x10));
      (*sf_glad_glGenerateMipmapEXT)(0xde1);
      (*sf_glad_glTexParameteri)(0xde1,0x2801,*(byte *)(in_RDI + 0x14) & 1 | 0x2702);
      *(undefined1 *)(in_RDI + 0x19) = 1;
      priv::TextureSaver::~TextureSaver((TextureSaver *)0x2ac1b5);
    }
    GlResource::TransientContextLock::~TransientContextLock(in_stack_ffffffffffffffd0);
  }
  return local_1;
}

Assistant:

bool Texture::generateMipmap()
{
    if (!m_texture)
        return false;

    TransientContextLock lock;

    // Make sure that extensions are initialized
    priv::ensureExtensionsInit();

    if (!GLEXT_framebuffer_object)
        return false;

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(GLEXT_glGenerateMipmap(GL_TEXTURE_2D));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR_MIPMAP_LINEAR : GL_NEAREST_MIPMAP_LINEAR));

    m_hasMipmap = true;

    return true;
}